

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libixy-vfio.c
# Opt level: O2

int vfio_init(char *pci_addr)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  ssize_t sVar5;
  char *pcVar6;
  int *piVar7;
  undefined8 uVar8;
  int cfd;
  int groupid;
  vfio_group_status group_status;
  char buf [512];
  stat st;
  char iommu_group_path [4096];
  char path [4096];
  
  snprintf(path,0x1000,"/sys/bus/pci/devices/%s/",pci_addr);
  iVar1 = stat(path,(stat *)&st);
  if (iVar1 < 0) {
    return -1;
  }
  sVar4 = strlen(path);
  strncat(path,"iommu_group",0xfff - sVar4);
  sVar5 = readlink(path,iommu_group_path,0x1000);
  if (sVar5 == -1) {
    piVar7 = __errno_location();
    iVar1 = *piVar7;
    __xpg_strerror_r(iVar1,buf,0x200);
    pcVar6 = "find the iommu_group for the device";
    uVar8 = 0xec;
  }
  else {
    iommu_group_path[(int)sVar5] = '\0';
    pcVar6 = __xpg_basename(iommu_group_path);
    iVar1 = __isoc99_sscanf(pcVar6,"%d",&groupid);
    if (iVar1 == -1) {
      piVar7 = __errno_location();
      iVar1 = *piVar7;
      __xpg_strerror_r(iVar1,buf,0x200);
      pcVar6 = "convert group id to int";
      uVar8 = 0xf1;
    }
    else {
      iVar1 = get_vfio_container();
      cfd = iVar1;
      if (iVar1 == -1) {
        iVar2 = open("/dev/vfio/vfio",2);
        if (iVar2 == -1) {
          piVar7 = __errno_location();
          iVar1 = *piVar7;
          __xpg_strerror_r(iVar1,buf,0x200);
          pcVar6 = "open /dev/vfio/vfio";
          uVar8 = 0xf8;
          goto LAB_0010689e;
        }
        cfd = iVar2;
        set_vfio_container(iVar2);
        iVar3 = ioctl(iVar2,0x3b64);
        if (iVar3 != 0) {
          piVar7 = __errno_location();
          iVar1 = *piVar7;
          __xpg_strerror_r(iVar1,buf,0x200);
          pcVar6 = "get a valid API version from the container";
          uVar8 = 0xfc;
          goto LAB_0010689e;
        }
        iVar2 = ioctl(iVar2,0x3b65,1);
        if (iVar2 != 1) {
          piVar7 = __errno_location();
          iVar1 = *piVar7;
          __xpg_strerror_r(iVar1,buf,0x200);
          pcVar6 = "get Type1 IOMMU support from the IOMMU container";
          uVar8 = 0xff;
          goto LAB_0010689e;
        }
      }
      snprintf(path,0x1000,"/dev/vfio/%d",(ulong)(uint)groupid);
      iVar2 = open(path,2);
      if (iVar2 == -1) {
        piVar7 = __errno_location();
        iVar1 = *piVar7;
        __xpg_strerror_r(iVar1,buf,0x200);
        pcVar6 = "open vfio group";
        uVar8 = 0x104;
      }
      else {
        group_status.argsz = 8;
        group_status.flags = 0;
        iVar3 = ioctl(iVar2,0x3b67);
        if (iVar3 == -1) {
          piVar7 = __errno_location();
          iVar1 = *piVar7;
          __xpg_strerror_r(iVar1,buf,0x200);
          pcVar6 = "get VFIO group status";
          uVar8 = 0x108;
        }
        else if (((ulong)group_status & 0x100000000) == 0) {
          piVar7 = __errno_location();
          iVar1 = *piVar7;
          __xpg_strerror_r(iVar1,buf,0x200);
          pcVar6 = "get viable VFIO group - are all devices in the group bound to the VFIO driver?";
          uVar8 = 0x109;
        }
        else {
          iVar3 = ioctl(iVar2,0x3b68,&cfd);
          if (iVar3 == -1) {
            piVar7 = __errno_location();
            iVar1 = *piVar7;
            __xpg_strerror_r(iVar1,buf,0x200);
            pcVar6 = "set container";
            uVar8 = 0x10c;
          }
          else if ((iVar1 == -1) && (iVar1 = ioctl(cfd,0x3b66,1), iVar1 == -1)) {
            piVar7 = __errno_location();
            iVar1 = *piVar7;
            __xpg_strerror_r(iVar1,buf,0x200);
            pcVar6 = "set IOMMU type";
            uVar8 = 0x112;
          }
          else {
            iVar1 = ioctl(iVar2,0x3b6a,pci_addr);
            if (iVar1 != -1) {
              vfio_enable_dma(iVar1);
              return iVar1;
            }
            piVar7 = __errno_location();
            iVar1 = *piVar7;
            __xpg_strerror_r(iVar1,buf,0x200);
            pcVar6 = "get device fd";
            uVar8 = 0x116;
          }
        }
      }
    }
  }
LAB_0010689e:
  fprintf(_stderr,"[ERROR] %s:%d %s(): Failed to %s: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",uVar8
          ,"vfio_init",pcVar6,buf);
  exit(iVar1);
}

Assistant:

int vfio_init(const char* pci_addr) {
	// find iommu group for the device
	// `readlink /sys/bus/pci/device/<segn:busn:devn.funcn>/iommu_group`
	char path[PATH_MAX], iommu_group_path[PATH_MAX];
	struct stat st;
	snprintf(path, sizeof(path), "/sys/bus/pci/devices/%s/", pci_addr);
	int ret = stat(path, &st);
	if (ret < 0) {
		// No such device
		return -1;
	}
	strncat(path, "iommu_group", sizeof(path) - strlen(path) - 1);

	int len = check_err(readlink(path, iommu_group_path, sizeof(iommu_group_path)), "find the iommu_group for the device");

	iommu_group_path[len] = '\0'; // append 0x00 to the string to end it
	char* group_name = basename(iommu_group_path);
	int groupid;
	check_err(sscanf(group_name, "%d", &groupid), "convert group id to int");

	int firstsetup = 0; // Need to set up the container exactly once
	int cfd = get_vfio_container();
	if (cfd == -1) {
		firstsetup = 1;
		// open vfio file to create new vfio container
		cfd = check_err(open("/dev/vfio/vfio", O_RDWR), "open /dev/vfio/vfio");
		set_vfio_container(cfd);

		// check if the container's API version is the same as the VFIO API's
		check_err((ioctl(cfd, VFIO_GET_API_VERSION) == VFIO_API_VERSION) - 1, "get a valid API version from the container");

		// check if type1 is supported
		check_err((ioctl(cfd, VFIO_CHECK_EXTENSION, VFIO_TYPE1_IOMMU) == 1) - 1, "get Type1 IOMMU support from the IOMMU container");
	}

	// open VFIO group containing the device
	snprintf(path, sizeof(path), "/dev/vfio/%d", groupid);
	int vfio_gfd = check_err(open(path, O_RDWR), "open vfio group");

	// check if group is viable
	struct vfio_group_status group_status = {.argsz = sizeof(group_status)};
	check_err(ioctl(vfio_gfd, VFIO_GROUP_GET_STATUS, &group_status), "get VFIO group status");
	check_err(((group_status.flags & VFIO_GROUP_FLAGS_VIABLE) > 0) - 1, "get viable VFIO group - are all devices in the group bound to the VFIO driver?");

	// Add group to container
	check_err(ioctl(vfio_gfd, VFIO_GROUP_SET_CONTAINER, &cfd), "set container");

	if (firstsetup != 0) {
		// Set vfio type (type1 is for IOMMU like VT-d or AMD-Vi) for the
		// container.
		// This can only be done after at least one group is in the container.
		ret = check_err(ioctl(cfd, VFIO_SET_IOMMU, VFIO_TYPE1_IOMMU), "set IOMMU type");
	}

	// get device file descriptor
	int vfio_fd = check_err(ioctl(vfio_gfd, VFIO_GROUP_GET_DEVICE_FD, pci_addr), "get device fd");

	// enable DMA
	vfio_enable_dma(vfio_fd);

	return vfio_fd;
}